

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O2

PackedFunc * __thiscall
tvm::runtime::TVMArgValue::operator_cast_to_PackedFunc
          (PackedFunc *__return_storage_ptr__,TVMArgValue *this)

{
  int *x;
  ostream *poVar1;
  char *pcVar2;
  LogCheckError _check_err;
  LogCheckError local_1b0;
  LogMessageFatal local_1a8;
  
  if ((this->super_TVMPODValue_).type_code_ == 4) {
    (__return_storage_ptr__->body_).super__Function_base._M_manager = (_Manager_type)0x0;
    (__return_storage_ptr__->body_)._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(__return_storage_ptr__->body_).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->body_).super__Function_base._M_functor + 8) = 0;
  }
  else {
    x = &(this->super_TVMPODValue_).type_code_;
    local_1a8.log_stream_ = (ostringstream)0xa;
    local_1a8._1_3_ = 0;
    dmlc::LogCheck_EQ<int,TVMTypeCode>((dmlc *)&local_1b0,x,(anon_enum_32 *)&local_1a8);
    if (local_1b0.str != (string *)0x0) {
      dmlc::LogMessageFatal::LogMessageFatal
                (&local_1a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/include/tvm/runtime/packed_func.h"
                 ,0x243);
      poVar1 = std::operator<<((ostream *)&local_1a8,"Check failed: ");
      poVar1 = std::operator<<(poVar1,"type_code_ == kFuncHandle");
      poVar1 = std::operator<<(poVar1,(string *)local_1b0.str);
      poVar1 = std::operator<<(poVar1,": ");
      poVar1 = std::operator<<(poVar1," expected ");
      poVar1 = std::operator<<(poVar1,"FunctionHandle");
      poVar1 = std::operator<<(poVar1," but get ");
      pcVar2 = TypeCode2Str(*x);
      std::operator<<(poVar1,pcVar2);
      dmlc::LogMessageFatal::~LogMessageFatal(&local_1a8);
    }
    dmlc::LogCheckError::~LogCheckError(&local_1b0);
    std::function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)>::function
              (&__return_storage_ptr__->body_,
               (function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *)
               (this->super_TVMPODValue_).value_.v_handle);
  }
  return __return_storage_ptr__;
}

Assistant:

operator PackedFunc() const {
    if (type_code_ == kNull)
      return PackedFunc();
    TVM_CHECK_TYPE_CODE(type_code_, kFuncHandle);
    return *ptr<PackedFunc>();
  }